

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O2

string * QUtil::hex_decode(string *__return_storage_ptr__,string *input)

{
  pointer pcVar1;
  size_type sVar2;
  bool bVar3;
  char cVar4;
  size_type sVar5;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pcVar1 = (input->_M_dataplus)._M_p;
  sVar2 = input->_M_string_length;
  bVar3 = true;
  for (sVar5 = 0; sVar2 != sVar5; sVar5 = sVar5 + 1) {
    cVar4 = ::qpdf::util::hex_decode_char(pcVar1[sVar5]);
    if (cVar4 < '\x10') {
      if (bVar3) {
        bVar3 = false;
      }
      else {
        bVar3 = true;
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
    }
  }
  if (!bVar3) {
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
QUtil::hex_decode(std::string const& input)
{
    std::string result;
    // We know result.size() <= 0.5 * input.size() + 1. However, reserving string space for this
    // upper bound has a negative impact.
    bool first = true;
    char decoded;
    for (auto ch: input) {
        ch = util::hex_decode_char(ch);
        if (ch < '\20') {
            if (first) {
                decoded = static_cast<char>(ch << 4);
                first = false;
            } else {
                result.push_back(decoded | ch);
                first = true;
            }
        }
    }
    if (!first) {
        result.push_back(decoded);
    }
    return result;
}